

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_str0(char *data,char *str)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(str);
  __dest = mp_encode_strl(data,(uint32_t)sVar1);
  memcpy(__dest,str,sVar1 & 0xffffffff);
  return __dest + (sVar1 & 0xffffffff);
}

Assistant:

MP_IMPL char *
mp_encode_str0(char *data, const char *str)
{
	return mp_encode_str(data, str, strlen(str));
}